

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true> __thiscall
duckdb::MultiFileReader::CreateDefault(MultiFileReader *this,string *function_name)

{
  pointer pMVar1;
  
  make_uniq<duckdb::MultiFileReader>();
  pMVar1 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pMVar1->function_name);
  return (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)
         (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)this;
}

Assistant:

unique_ptr<MultiFileReader> MultiFileReader::CreateDefault(const string &function_name) {
	auto res = make_uniq<MultiFileReader>();
	res->function_name = function_name;
	return res;
}